

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsenumber.cpp
# Opt level: O0

NumberType ICM::Parser::parseInteger(string *str,uint64_t *value,bool minus,Format format)

{
  NumberType NVar1;
  uint64_t uVar2;
  char *pcVar3;
  allocator local_61;
  string local_60;
  undefined1 local_40 [8];
  string s;
  Format format_local;
  bool minus_local;
  uint64_t *value_local;
  string *str_local;
  
  pcVar3 = "";
  if (minus) {
    pcVar3 = "-";
  }
  s.field_2._8_4_ = format;
  s.field_2._M_local_buf[0xf] = minus;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 pcVar3,str);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,pcVar3,&local_61);
  uVar2 = std::__cxx11::stoll(&local_60,(size_t *)0x0,s.field_2._8_4_);
  *value = uVar2;
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  NVar1 = getLimitTypeInt(value);
  std::__cxx11::string::~string((string *)local_40);
  return NVar1;
}

Assistant:

static NumberType parseInteger(const string &str, uint64_t &value, bool minus, Format format)
		{
			string s = (minus ? "-" : "") + str;
			(int64_t&)value = std::stoll(s.c_str(), 0, format);
			return getLimitTypeInt(value);
		}